

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bin_io_binary_write.cpp
# Opt level: O3

bool __thiscall
ritobin::io::impl_binary_write::BinBinaryWriter::write_value_visit
          (BinBinaryWriter *this,Embed *value)

{
  vector<char,_std::allocator<char>_> *pvVar1;
  pointer pFVar2;
  pointer pcVar3;
  __visit_result_t<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_moonshadow565[P]ritobin_ritobin_lib_src_ritobin_bin_types_helper_hpp:14:31),_const_std::variant<ritobin::None,_ritobin::Bool,_ritobin::I8,_ritobin::U8,_ritobin::I16,_ritobin::U16,_ritobin::I32,_ritobin::U32,_ritobin::I64,_ritobin::U64,_ritobin::F32,_ritobin::Vec2,_ritobin::Vec3,_ritobin::Vec4,_ritobin::Mtx44,_ritobin::RGBA,_ritobin::String,_ritobin::Hash,_ritobin::File,_ritobin::List,_ritobin::List2,_ritobin::Pointer,_ritobin::Embed,_ritobin::Link,_ritobin::Option,_ritobin::Map,_ritobin::Flag>_&>
  _Var4;
  bool bVar5;
  ssize_t sVar6;
  size_t in_RCX;
  void *__buf;
  char *msg;
  long lVar7;
  pointer pFVar8;
  anon_class_1_0_00000001 local_29;
  
  BinaryWriter::write<unsigned_int>(&this->writer,(value->name).hash_);
  pvVar1 = (this->writer).buffer_;
  lVar7 = (long)(pvVar1->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(pvVar1->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                super__Vector_impl_data._M_start;
  BinaryWriter::write<unsigned_int>(&this->writer,0);
  BinaryWriter::write<unsigned_short>
            (&this->writer,
             (short)((uint)(*(int *)&(value->items).
                                     super__Vector_base<ritobin::Field,_std::allocator<ritobin::Field>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                           *(int *)&(value->items).
                                    super__Vector_base<ritobin::Field,_std::allocator<ritobin::Field>_>
                                    ._M_impl.super__Vector_impl_data._M_start) >> 4) * 0x6db7);
  pFVar8 = (value->items).super__Vector_base<ritobin::Field,_std::allocator<ritobin::Field>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pFVar2 = (value->items).super__Vector_base<ritobin::Field,_std::allocator<ritobin::Field>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  if (pFVar8 != pFVar2) {
    do {
      BinaryWriter::write<unsigned_int>(&this->writer,(pFVar8->key).hash_);
      _Var4 = std::
              visit<ritobin::ValueHelperImpl<std::variant<ritobin::None,ritobin::Bool,ritobin::I8,ritobin::U8,ritobin::I16,ritobin::U16,ritobin::I32,ritobin::U32,ritobin::I64,ritobin::U64,ritobin::F32,ritobin::Vec2,ritobin::Vec3,ritobin::Vec4,ritobin::Mtx44,ritobin::RGBA,ritobin::String,ritobin::Hash,ritobin::File,ritobin::List,ritobin::List2,ritobin::Pointer,ritobin::Embed,ritobin::Link,ritobin::Option,ritobin::Map,ritobin::Flag>>::value_to_type(std::variant<ritobin::None,ritobin::Bool,ritobin::I8,ritobin::U8,ritobin::I16,ritobin::U16,ritobin::I32,ritobin::U32,ritobin::I64,ritobin::U64,ritobin::F32,ritobin::Vec2,ritobin::Vec3,ritobin::Vec4,ritobin::Mtx44,ritobin::RGBA,ritobin::String,ritobin::Hash,ritobin::File,ritobin::List,ritobin::List2,ritobin::Pointer,ritobin::Embed,ritobin::Link,ritobin::Option,ritobin::Map,ritobin::Flag>const&)::_lambda(auto:1&&)_1_,std::variant<ritobin::None,ritobin::Bool,ritobin::I8,ritobin::U8,ritobin::I16,ritobin::U16,ritobin::I32,ritobin::U32,ritobin::I64,ritobin::U64,ritobin::F32,ritobin::Vec2,ritobin::Vec3,ritobin::Vec4,ritobin::Mtx44,ritobin::RGBA,ritobin::String,ritobin::Hash,ritobin::File,ritobin::List,ritobin::List2,ritobin::Pointer,ritobin::Embed,ritobin::Link,ritobin::Option,ritobin::Map,ritobin::Flag>const&>
                        (&local_29,&pFVar8->value);
      sVar6 = BinaryWriter::write(&this->writer,(uint)_Var4,__buf,in_RCX);
      if ((char)sVar6 == '\0') {
        msg = "writer.write(ValueHelper::value_to_type(item))\n";
LAB_00115ed3:
        bVar5 = fail_msg(this,msg);
        return bVar5;
      }
      bVar5 = write_value(this,&pFVar8->value);
      if (!bVar5) {
        msg = "write_value(item)\n";
        goto LAB_00115ed3;
      }
      pFVar8 = pFVar8 + 1;
    } while (pFVar8 != pFVar2);
  }
  pvVar1 = (this->writer).buffer_;
  pcVar3 = (pvVar1->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data
           ._M_start;
  *(int *)(pcVar3 + lVar7) =
       (*(int *)&(pvVar1->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                 super__Vector_impl_data._M_finish - ((int)lVar7 + (int)pcVar3)) + -4;
  return true;
}

Assistant:

bool write_value_visit(Embed const& value) noexcept {
            writer.write(value.name);
            size_t position = writer.position();
            writer.write(uint32_t{ 0 });
            writer.write(static_cast<uint16_t>(value.items.size()));
            for (auto const& [name, item] : value.items) {
                writer.write(name.hash());
                bin_assert(writer.write(ValueHelper::value_to_type(item)));
                bin_assert(write_value(item));
            }
            writer.write_at(position, writer.position() - position - 4);
            return true;
        }